

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

string * __thiscall
cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DescriptorKeyInfo *this)

{
  undefined1 *puVar1;
  long lVar2;
  string *psVar3;
  bool bVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  string local_58;
  string local_38;
  
  switch(this->key_type_) {
  case kDescriptorKeyPublic:
    bVar4 = Privkey::IsValid(&this->privkey_);
    if (bVar4) {
      ::std::operator+(__return_storage_ptr__,&this->parent_info_,&this->key_string_);
      return __return_storage_ptr__;
    }
    Pubkey::GetHex_abi_cxx11_(&local_58,&this->pubkey_);
    plVar6 = (long *)::std::__cxx11::string::replace
                               ((ulong)&local_58,0,(char *)0x0,
                                (ulong)(this->parent_info_)._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar7) {
      lVar2 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    psVar3 = &local_58;
    goto LAB_0031ad84;
  case kDescriptorKeyBip32:
    ExtPubkey::ToString_abi_cxx11_(&local_38,&this->extpubkey_);
    puVar5 = (undefined8 *)
             ::std::__cxx11::string::replace
                       ((ulong)&local_38,0,(char *)0x0,(ulong)(this->parent_info_)._M_dataplus._M_p)
    ;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_58.field_2._M_allocated_capacity = *psVar7;
      local_58.field_2._8_8_ = puVar5[3];
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar7;
      local_58._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_58._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_58,(ulong)(this->path_)._M_dataplus._M_p);
    break;
  case kDescriptorKeyBip32Priv:
    ExtPrivkey::ToString_abi_cxx11_(&local_38,&this->extprivkey_);
    plVar6 = (long *)::std::__cxx11::string::replace
                               ((ulong)&local_38,0,(char *)0x0,
                                (ulong)(this->parent_info_)._M_dataplus._M_p);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_58.field_2._M_allocated_capacity = *psVar7;
      local_58.field_2._8_8_ = plVar6[3];
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar7;
      local_58._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_58._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_58,(ulong)(this->path_)._M_dataplus._M_p);
    break;
  case kDescriptorKeySchnorr:
    SchnorrPubkey::GetHex_abi_cxx11_(&local_38,&this->schnorr_pubkey_);
    puVar5 = (undefined8 *)
             ::std::__cxx11::string::replace
                       ((ulong)&local_38,0,(char *)0x0,(ulong)(this->parent_info_)._M_dataplus._M_p)
    ;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_58.field_2._M_allocated_capacity = *psVar7;
      local_58.field_2._8_8_ = puVar5[3];
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar7;
      local_58._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_58._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_58,(ulong)(this->path_)._M_dataplus._M_p);
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    lVar2 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  psVar3 = &local_38;
LAB_0031ad84:
  puVar1 = (undefined1 *)(&(psVar3->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 != &psVar3->field_2) {
    operator_delete(puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorKeyInfo::ToString() const {
  if (key_type_ == DescriptorKeyType::kDescriptorKeyPublic) {
    if (privkey_.IsValid()) {
      return parent_info_ + key_string_;
    } else {
      return parent_info_ + pubkey_.GetHex();
    }
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32) {
    return parent_info_ + extpubkey_.ToString() + path_;
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
    return parent_info_ + extprivkey_.ToString() + path_;
  } else if (key_type_ == DescriptorKeyType::kDescriptorKeySchnorr) {
    return parent_info_ + schnorr_pubkey_.GetHex() + path_;
  } else {
    return "";
  }
}